

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

void Abc_NtkDumpOneCexSpecial(FILE *pFile,Abc_Ntk_t *pNtk,Abc_Cex_t *pCex)

{
  Abc_Ntk_t *pAVar1;
  int iVar2;
  Aig_Man_t *p;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pObj_00;
  char *pcVar4;
  Aig_Man_t *pAig;
  Abc_Obj_t *pObj;
  int f;
  int i;
  Abc_Cex_t *pCare;
  Abc_Cex_t *pCex_local;
  Abc_Ntk_t *pNtk_local;
  FILE *pFile_local;
  
  _f = (Abc_Cex_t *)0x0;
  pCare = pCex;
  pCex_local = (Abc_Cex_t *)pNtk;
  pNtk_local = (Abc_Ntk_t *)pFile;
  p = Abc_NtkToDar(pNtk,0,1);
  iVar2 = Saig_ManPiNum(p);
  _f = Bmc_CexCareMinimize(p,iVar2,pCare,4,0,0);
  Aig_ManStop(p);
  if (_f == (Abc_Cex_t *)0x0) {
    printf("Counter-example minimization has failed.\n");
  }
  else {
    for (pObj._4_4_ = 0; iVar2 = Vec_PtrSize(*(Vec_Ptr_t **)(pCex_local + 4)), pObj._4_4_ < iVar2;
        pObj._4_4_ = pObj._4_4_ + 1) {
      pAVar3 = Abc_NtkBox((Abc_Ntk_t *)pCex_local,pObj._4_4_);
      iVar2 = Abc_ObjIsLatch(pAVar3);
      pAVar1 = pNtk_local;
      if (iVar2 != 0) {
        pObj_00 = Abc_ObjFanout0(pAVar3);
        pcVar4 = Abc_ObjName(pObj_00);
        iVar2 = Abc_LatchIsInit0(pAVar3);
        fprintf((FILE *)pAVar1,"CEX: %s@0=%c\n",pcVar4,(ulong)(((iVar2 != 0 ^ 0xffU) & 1) + 0x30));
      }
    }
    for (pObj._0_4_ = 0; (int)(uint)pObj <= pCare->iFrame; pObj._0_4_ = (uint)pObj + 1) {
      for (pObj._4_4_ = 0; iVar2 = Abc_NtkPiNum((Abc_Ntk_t *)pCex_local), pObj._4_4_ < iVar2;
          pObj._4_4_ = pObj._4_4_ + 1) {
        pAVar3 = Abc_NtkPi((Abc_Ntk_t *)pCex_local,pObj._4_4_);
        if ((_f == (Abc_Cex_t *)0x0) ||
           (iVar2 = Abc_InfoHasBit((uint *)(_f + 1),_f->nRegs + _f->nPis * (uint)pObj + pObj._4_4_),
           iVar2 != 0)) {
          pAVar1 = pNtk_local;
          pcVar4 = Abc_ObjName(pAVar3);
          iVar2 = Abc_InfoHasBit((uint *)(pCare + 1),
                                 pCare->nRegs + pCare->nPis * (uint)pObj + pObj._4_4_);
          fprintf((FILE *)pAVar1,"CEX: %s@%d=%c\n",pcVar4,(ulong)(uint)pObj,(ulong)(iVar2 + 0x30));
        }
      }
    }
    Abc_CexFreeP((Abc_Cex_t **)&f);
  }
  return;
}

Assistant:

void Abc_NtkDumpOneCexSpecial( FILE * pFile, Abc_Ntk_t * pNtk, Abc_Cex_t * pCex )
{
    Abc_Cex_t * pCare = NULL; int i, f; Abc_Obj_t * pObj;
    extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );
    Aig_Man_t * pAig = Abc_NtkToDar( pNtk, 0, 1 );
    //fprintf( pFile, "# FALSIFYING OUTPUTS:");                                       
    //fprintf( pFile, " %s", Abc_ObjName(Abc_NtkCo(pNtk, pCex->iPo)) ); 
    pCare = Bmc_CexCareMinimize( pAig, Saig_ManPiNum(pAig), pCex, 4, 0, 0 );
    Aig_ManStop( pAig );
    if( pCare == NULL )   
    {
        printf( "Counter-example minimization has failed.\n" ); 
        return;
    }
    // output flop values (unaffected by the minimization)
    Abc_NtkForEachLatch( pNtk, pObj, i )
        fprintf( pFile, "CEX: %s@0=%c\n", Abc_ObjName(Abc_ObjFanout0(pObj)), '0'+!Abc_LatchIsInit0(pObj) );
    // output PI values (while skipping the minimized ones)
    for ( f = 0; f <= pCex->iFrame; f++ )
        Abc_NtkForEachPi( pNtk, pObj, i )
            if ( !pCare || Abc_InfoHasBit(pCare->pData, pCare->nRegs+pCare->nPis*f + i) )
                fprintf( pFile, "CEX: %s@%d=%c\n", Abc_ObjName(pObj), f, '0'+Abc_InfoHasBit(pCex->pData, pCex->nRegs+pCex->nPis*f + i) );
    Abc_CexFreeP( &pCare );
}